

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

string * getNextIp(string *__return_storage_ptr__,string *baseIp,int iter)

{
  uint uVar1;
  in_addr_t iVar2;
  char *__s;
  int iVar3;
  bool bVar4;
  string local_50 [39];
  allocator<char> local_29;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)baseIp);
  iVar3 = 0;
  if (0 < iter) {
    iVar3 = iter;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    iVar2 = inet_addr((__return_storage_ptr__->_M_dataplus)._M_p);
    uVar1 = (iVar2 >> 0x18 | (iVar2 & 0xff0000) >> 8 | (iVar2 & 0xff00) << 8 | iVar2 << 0x18) + 1;
    __s = inet_ntoa((in_addr)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 * 0x1000000));
    std::__cxx11::string::string<std::allocator<char>>(local_50,__s,&local_29);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getNextIp(std::string baseIp, const int iter = 1)
{
    std::string nextIp = std::move(baseIp);
    for (int i = 0; i < iter; i++)
    {
        // convert the input IP address to an integer
        in_addr_t address = inet_addr(nextIp.c_str());

        // add one to the value (making sure to get the correct byte orders)
        address = ntohl(address);
        address += 1;
        address = htonl(address);

        // pack the address into the struct inet_ntoa expects
        struct in_addr address_struct;
        address_struct.s_addr = address;

        // convert back to a string
        nextIp = std::string(inet_ntoa(address_struct));
    }
    return nextIp;
}